

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall
ProblemTest_CompareCommonExprs_Test::~ProblemTest_CompareCommonExprs_Test
          (ProblemTest_CompareCommonExprs_Test *this)

{
  void *in_RDI;
  
  ~ProblemTest_CompareCommonExprs_Test((ProblemTest_CompareCommonExprs_Test *)0x13b898);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ProblemTest, CompareCommonExprs) {
  Problem p;
  p.AddCommonExpr(mp::NumericExpr());
  p.AddCommonExpr(mp::NumericExpr());
  EXPECT_TRUE(p.common_expr(0) == p.common_expr(0));
  EXPECT_TRUE(p.common_expr(0) != p.common_expr(1));
  EXPECT_FALSE(p.common_expr(0) != p.common_expr(0));
  EXPECT_FALSE(p.common_expr(0) == p.common_expr(1));
}